

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonDocument::operator[](QJsonDocument *this,QStringView key)

{
  long lVar1;
  QStringView s;
  bool bVar2;
  QCborValue *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QJsonDocument *in_stack_ffffffffffffff58;
  QCborValue *this_00;
  undefined4 in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff84;
  QCborValue *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RSI;
  bVar2 = isObject(in_stack_ffffffffffffff58);
  if (bVar2) {
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               0x48f17e);
    ::QCborValue::toMap(this_01);
    s.m_size._4_4_ = in_stack_ffffffffffffff84;
    s.m_size._0_4_ = in_stack_ffffffffffffff80;
    s.m_data = (storage_type_conflict *)this_01;
    ::QCborValue::QCborValue(this_00,s);
    QCborMap::value((QCborMap *)in_RSI,this_00);
    QJsonPrivate::Value::fromTrustedCbor(this_00);
    ::QCborValue::~QCborValue(in_RDI);
    ::QCborValue::~QCborValue(in_RDI);
    QCborMap::~QCborMap((QCborMap *)0x48f1f9);
  }
  else {
    QJsonValue::QJsonValue((QJsonValue *)this_01,in_stack_ffffffffffffff84);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QJsonValue *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

const QJsonValue QJsonDocument::operator[](QStringView key) const
{
    if (!isObject())
        return QJsonValue(QJsonValue::Undefined);

    return QJsonPrivate::Value::fromTrustedCbor(d->value.toMap().value(key));
}